

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void selectAddSubqueryTypeInfo(Walker *pWalker,Select *p)

{
  SrcList *pSVar1;
  Parse *pParse;
  Select *pSVar2;
  Select *pSelect;
  int iVar3;
  SrcList_item *pSVar4;
  
  if (-1 < (char)p->selFlags) {
    p->selFlags = p->selFlags | 0x80;
    pSVar1 = p->pSrc;
    if (0 < pSVar1->nSrc) {
      pParse = pWalker->pParse;
      pSVar4 = pSVar1->a;
      iVar3 = 0;
      do {
        if (((pSVar4->pTab->tabFlags & 2) != 0) &&
           (pSVar2 = pSVar4->pSelect, pSVar4->pSelect != (Select *)0x0)) {
          do {
            pSelect = pSVar2;
            pSVar2 = pSelect->pPrior;
          } while (pSVar2 != (Select *)0x0);
          sqlite3SelectAddColumnTypeAndCollation(pParse,pSVar4->pTab,pSelect);
        }
        iVar3 = iVar3 + 1;
        pSVar4 = pSVar4 + 1;
      } while (iVar3 < pSVar1->nSrc);
    }
  }
  return;
}

Assistant:

static void selectAddSubqueryTypeInfo(Walker *pWalker, Select *p){
  Parse *pParse;
  int i;
  SrcList *pTabList;
  struct SrcList_item *pFrom;

  assert( p->selFlags & SF_Resolved );
  if( p->selFlags & SF_HasTypeInfo ) return;
  p->selFlags |= SF_HasTypeInfo;
  pParse = pWalker->pParse;
  pTabList = p->pSrc;
  for(i=0, pFrom=pTabList->a; i<pTabList->nSrc; i++, pFrom++){
    Table *pTab = pFrom->pTab;
    assert( pTab!=0 );
    if( (pTab->tabFlags & TF_Ephemeral)!=0 ){
      /* A sub-query in the FROM clause of a SELECT */
      Select *pSel = pFrom->pSelect;
      if( pSel ){
        while( pSel->pPrior ) pSel = pSel->pPrior;
        sqlite3SelectAddColumnTypeAndCollation(pParse, pTab, pSel);
      }
    }
  }
}